

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<unsigned_long,std::allocator<unsigned_long>>,void>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *container,ostream *os)

{
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  long lVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  puVar3 = (container->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (container->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    lVar4 = 0;
    do {
      puVar3 = puVar3 + 1;
      if (lVar4 == 0) {
LAB_001978d1:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar4 = lVar4 + 1;
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar4 != 0x20) goto LAB_001978d1;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar4 = 0x20;
        bVar2 = true;
      }
    } while ((!bVar2) && (puVar3 != puVar1));
    if (lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }